

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btcp.c
# Opt level: O0

void nn_btcp_start_listening(nn_btcp *self)

{
  FILE *__stream;
  uint16_t __hostshort;
  char *pcVar1;
  size_t sVar2;
  char *pcVar3;
  uint16_t port;
  char *pos;
  char *end;
  char *addr;
  size_t ipv4onlylen;
  size_t sStack_a0;
  int ipv4only;
  size_t sslen;
  sockaddr_storage ss;
  int rc;
  nn_btcp *self_local;
  
  pcVar1 = nn_epbase_getaddr(&self->epbase);
  memset(&sslen,0,0x80);
  sVar2 = strlen(pcVar1);
  pcVar3 = strrchr(pcVar1,0x3a);
  if (pcVar3 == (char *)0x0) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","pos",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/transports/tcp/btcp.c"
            ,0x1ba);
    fflush(_stderr);
    nn_err_abort();
  }
  pcVar3 = pcVar3 + 1;
  ss.__ss_align._4_4_ = nn_port_resolve(pcVar3,(size_t)(pcVar1 + (sVar2 - (long)pcVar3)));
  if (ss.__ss_align._4_4_ < 0) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","rc >= 0",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/transports/tcp/btcp.c"
            ,0x1bd);
    fflush(_stderr);
    nn_err_abort();
  }
  __hostshort = (uint16_t)ss.__ss_align._4_4_;
  addr = (char *)0x4;
  nn_epbase_getopt(&self->epbase,0,0xe,(void *)((long)&ipv4onlylen + 4),(size_t *)&addr);
  if (addr != (char *)0x4) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","ipv4onlylen == sizeof (ipv4only)",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/transports/tcp/btcp.c"
            ,0x1c4);
    fflush(_stderr);
    nn_err_abort();
  }
  ss.__ss_align._4_4_ =
       nn_iface_resolve(pcVar1,(size_t)(pcVar3 + (-1 - (long)pcVar1)),ipv4onlylen._4_4_,
                        (sockaddr_storage *)&sslen,&stack0xffffffffffffff60);
  __stream = _stderr;
  if (ss.__ss_align._4_4_ != 0) {
    pcVar1 = nn_err_strerror(-ss.__ss_align._4_4_);
    fprintf(__stream,"%s [%d] (%s:%d)\n",pcVar1,(ulong)(uint)-ss.__ss_align._4_4_,
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/transports/tcp/btcp.c"
            ,0x1c6);
    fflush(_stderr);
    nn_err_abort();
  }
  if ((ushort)sslen == 2) {
    sslen._2_2_ = htons(__hostshort);
    sStack_a0 = 0x10;
  }
  else {
    if ((ushort)sslen != 10) {
      fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","0",
              "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/transports/tcp/btcp.c"
              ,0x1d2);
      fflush(_stderr);
      nn_err_abort();
    }
    sslen._2_2_ = htons(__hostshort);
    sStack_a0 = 0x1c;
  }
  ss.__ss_align._4_4_ = nn_usock_start(&self->usock,(uint)(ushort)sslen,1,0);
  if (ss.__ss_align._4_4_ < 0) {
    nn_backoff_start(&self->retry);
    self->state = 7;
  }
  else {
    ss.__ss_align._4_4_ = nn_usock_bind(&self->usock,(sockaddr *)&sslen,sStack_a0);
    if (ss.__ss_align._4_4_ < 0) {
      nn_usock_stop(&self->usock);
      self->state = 8;
    }
    else {
      ss.__ss_align._4_4_ = nn_usock_listen(&self->usock,100);
      if (ss.__ss_align._4_4_ < 0) {
        nn_usock_stop(&self->usock);
        self->state = 8;
      }
      else {
        nn_btcp_start_accepting(self);
        self->state = 2;
      }
    }
  }
  return;
}

Assistant:

static void nn_btcp_start_listening (struct nn_btcp *self)
{
    int rc;
    struct sockaddr_storage ss;
    size_t sslen;
    int ipv4only;
    size_t ipv4onlylen;
    const char *addr;
    const char *end;
    const char *pos;
    uint16_t port;

    /*  First, resolve the IP address. */
    addr = nn_epbase_getaddr (&self->epbase);
    memset (&ss, 0, sizeof (ss));

    /*  Parse the port. */
    end = addr + strlen (addr);
    pos = strrchr (addr, ':');
    nn_assert (pos);
    ++pos;
    rc = nn_port_resolve (pos, end - pos);
    nn_assert (rc >= 0);
    port = rc;

    /*  Parse the address. */
    ipv4onlylen = sizeof (ipv4only);
    nn_epbase_getopt (&self->epbase, NN_SOL_SOCKET, NN_IPV4ONLY,
        &ipv4only, &ipv4onlylen);
    nn_assert (ipv4onlylen == sizeof (ipv4only));
    rc = nn_iface_resolve (addr, pos - addr - 1, ipv4only, &ss, &sslen);
    errnum_assert (rc == 0, -rc);

    /*  Combine the port and the address. */
    if (ss.ss_family == AF_INET) {
        ((struct sockaddr_in*) &ss)->sin_port = htons (port);
        sslen = sizeof (struct sockaddr_in);
    }
    else if (ss.ss_family == AF_INET6) {
        ((struct sockaddr_in6*) &ss)->sin6_port = htons (port);
        sslen = sizeof (struct sockaddr_in6);
    }
    else
        nn_assert (0);

    /*  Start listening for incoming connections. */
    rc = nn_usock_start (&self->usock, ss.ss_family, SOCK_STREAM, 0);
    if (nn_slow (rc < 0)) {
        nn_backoff_start (&self->retry);
        self->state = NN_BTCP_STATE_WAITING;
        return;
    }

    rc = nn_usock_bind (&self->usock, (struct sockaddr*) &ss, (size_t) sslen);
    if (nn_slow (rc < 0)) {
        nn_usock_stop (&self->usock);
        self->state = NN_BTCP_STATE_CLOSING;
        return;
    }

    rc = nn_usock_listen (&self->usock, NN_BTCP_BACKLOG);
    if (nn_slow (rc < 0)) {
        nn_usock_stop (&self->usock);
        self->state = NN_BTCP_STATE_CLOSING;
        return;
    }
    nn_btcp_start_accepting(self);
    self->state = NN_BTCP_STATE_ACTIVE;
}